

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::scrollTreeView(UEFITool *this,QListWidgetItem *item)

{
  bool bVar1;
  QModelIndex *this_00;
  long *plVar2;
  QByteArray second;
  QVariant local_30;
  
  (**(code **)(*(long *)item + 0x18))(&local_30,item,0x100);
  QVariant::toByteArray();
  QVariant::~QVariant(&local_30);
  this_00 = (QModelIndex *)QByteArray::data(&second);
  if (this_00 != (QModelIndex *)0x0) {
    bVar1 = QModelIndex::isValid(this_00);
    if (bVar1) {
      (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))(*(long **)(this->ui + 0x130),this_00,3);
      plVar2 = (long *)QAbstractItemView::selectionModel();
      (**(code **)(*plVar2 + 0x68))(plVar2,this_00,0x23);
    }
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&second.d);
  return;
}

Assistant:

void UEFITool::scrollTreeView(QListWidgetItem* item)
{
    QByteArray second = item->data(Qt::UserRole).toByteArray();
    QModelIndex *index = (QModelIndex *)second.data();
    if (index && index->isValid()) {
        ui->structureTreeView->scrollTo(*index, QAbstractItemView::PositionAtCenter);
        ui->structureTreeView->selectionModel()->select(*index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
    }
}